

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobalObject.cpp
# Opt level: O2

PropertyQueryFlags __thiscall
Js::GlobalObject::GetItemReferenceQuery
          (GlobalObject *this,Var originalInstance,uint32 index,Var *value,
          ScriptContext *requestContext)

{
  RecyclableObject *pRVar1;
  HostObjectBase *pHVar2;
  PropertyQueryFlags PVar3;
  int iVar4;
  PropertyQueryFlags PVar5;
  
  PVar3 = DynamicObject::GetItemReferenceQuery
                    ((DynamicObject *)this,originalInstance,index,value,requestContext);
  PVar5 = Property_Found;
  if (PVar3 != Property_Found) {
    pRVar1 = (this->directHostObject).ptr;
    if ((pRVar1 != (RecyclableObject *)0x0) &&
       (iVar4 = (*(pRVar1->super_FinalizableObject).super_IRecyclerVisitedObject.
                  _vptr_IRecyclerVisitedObject[0x27])
                          (pRVar1,originalInstance,(ulong)index,value,requestContext), iVar4 == 1))
    {
      return Property_Found;
    }
    pHVar2 = (this->super_RootObjectBase).hostObject.ptr;
    if (pHVar2 == (HostObjectBase *)0x0) {
      PVar5 = Property_NotFound;
    }
    else {
      iVar4 = (**(code **)(*(long *)pHVar2 + 0x138))
                        (pHVar2,originalInstance,index,value,requestContext);
      PVar5 = (PropertyQueryFlags)(iVar4 == 1);
    }
  }
  return PVar5;
}

Assistant:

PropertyQueryFlags GlobalObject::GetItemReferenceQuery(Var originalInstance, uint32 index, Var* value, ScriptContext* requestContext)
    {
        if (JavascriptConversion::PropertyQueryFlagsToBoolean(DynamicObject::GetItemReferenceQuery(originalInstance, index, value, requestContext)))
        {
            return PropertyQueryFlags::Property_Found;
        }
        return JavascriptConversion::BooleanToPropertyQueryFlags(
            (this->directHostObject && JavascriptConversion::PropertyQueryFlagsToBoolean(this->directHostObject->GetItemReferenceQuery(originalInstance, index, value, requestContext))) ||
            (this->hostObject && JavascriptConversion::PropertyQueryFlagsToBoolean(this->hostObject->GetItemReferenceQuery(originalInstance, index, value, requestContext))));
    }